

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O1

void __thiscall Hpipe::Vec<unsigned_int>::Vec(Vec<unsigned_int> *this,uint a)

{
  uint *puVar1;
  uint local_14;
  
  (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == (uint *)0x0) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,(iterator)0x0,&local_14);
  }
  else {
    *puVar1 = a;
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1 + 1;
  }
  return;
}

Assistant:

Vec( T a ) { push_back( a ); }